

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_passRowName(void *highs,HighsInt row,char *name)

{
  HighsStatus HVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  HVar1 = Highs::passRowName((Highs *)highs,row,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_passRowName(const void* highs, const HighsInt row,
                           const char* name) {
  return (HighsInt)((Highs*)highs)->passRowName(row, std::string(name));
}